

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtabbar.cpp
# Opt level: O0

void __thiscall QTabBar::removeTab(QTabBar *this,int index)

{
  bool bVar1;
  int iVar2;
  QTabBarPrivate *this_00;
  const_reference ppTVar3;
  const_iterator o;
  Tab **ppTVar4;
  qsizetype qVar5;
  int in_ESI;
  QTabBarPrivate *in_RDI;
  long in_FS_OFFSET;
  QRect QVar6;
  int bump;
  Tab *tab;
  add_const_t<QList<QTabBarPrivate::Tab_*>_> *__range2;
  int newIndex;
  Tab *removedTab;
  QTabBarPrivate *d;
  const_iterator __end2;
  const_iterator __begin2;
  undefined4 in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff5c;
  uint in_stack_ffffffffffffff60;
  SelectionBehavior in_stack_ffffffffffffff64;
  undefined8 in_stack_ffffffffffffff68;
  Tab *this_01;
  undefined4 in_stack_ffffffffffffff78;
  uint in_stack_ffffffffffffff7c;
  Tab *in_stack_ffffffffffffff80;
  int index_00;
  QList<QTabBarPrivate::Tab_*> *this_02;
  undefined8 local_4c;
  undefined8 local_44;
  undefined8 local_3c;
  undefined8 local_34;
  const_iterator local_18;
  int local_c;
  long local_8;
  
  iVar2 = (int)((ulong)in_stack_ffffffffffffff68 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_c = in_ESI;
  this_00 = d_func((QTabBar *)0x6ad537);
  bVar1 = QTabBarPrivate::validIndex(in_RDI,iVar2);
  if (bVar1) {
    ppTVar3 = QList<QTabBarPrivate::Tab_*>::at
                        ((QList<QTabBarPrivate::Tab_*> *)
                         CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                         CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    this_01 = *ppTVar3;
    if ((*(ushort *)&this_00->field_0x2d0 >> 9 & 1) != 0) {
      QTabBarPrivate::moveTabFinished(this_00,(int)((ulong)this_01 >> 0x20));
    }
    QList<QTabBarPrivate::Tab_*>::at
              ((QList<QTabBarPrivate::Tab_*> *)
               CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
               CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    QWidget::releaseShortcut((QWidget *)in_RDI,iVar2);
    if (this_01->leftWidget != (QWidget *)0x0) {
      QWidget::hide((QWidget *)0x6ad5f2);
      QObject::deleteLater();
      this_01->leftWidget = (QWidget *)0x0;
    }
    if (this_01->rightWidget != (QWidget *)0x0) {
      QWidget::hide((QWidget *)0x6ad633);
      QObject::deleteLater();
      this_01->rightWidget = (QWidget *)0x0;
    }
    QList<QTabBarPrivate::Tab_*>::removeAt
              ((QList<QTabBarPrivate::Tab_*> *)
               CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
               CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    if (this_01 != (Tab *)0x0) {
      QTabBarPrivate::Tab::~Tab
                ((Tab *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
      operator_delete(this_01,0xf0);
    }
    this_02 = &this_00->tabList;
    local_18.i = (Tab **)&DAT_aaaaaaaaaaaaaaaa;
    local_18 = QList<QTabBarPrivate::Tab_*>::begin
                         ((QList<QTabBarPrivate::Tab_*> *)
                          CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
    o = QList<QTabBarPrivate::Tab_*>::end
                  ((QList<QTabBarPrivate::Tab_*> *)
                   CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
    while (bVar1 = QList<QTabBarPrivate::Tab_*>::const_iterator::operator!=(&local_18,o), bVar1) {
      ppTVar4 = QList<QTabBarPrivate::Tab_*>::const_iterator::operator*(&local_18);
      in_stack_ffffffffffffff80 = *ppTVar4;
      if (in_stack_ffffffffffffff80->lastTab == local_c) {
        in_stack_ffffffffffffff80->lastTab = -1;
      }
      if (local_c < in_stack_ffffffffffffff80->lastTab) {
        in_stack_ffffffffffffff80->lastTab = in_stack_ffffffffffffff80->lastTab + -1;
      }
      QList<QTabBarPrivate::Tab_*>::const_iterator::operator++(&local_18);
    }
    QTabBarPrivate::calculateFirstLastVisible
              (in_RDI,in_stack_ffffffffffffff7c,SUB81((ulong)this_01 >> 0x38,0),
               SUB81((ulong)this_01 >> 0x30,0));
    if (local_c == this_00->currentIndex) {
      this_00->currentIndex = -1;
      qVar5 = QList<QTabBarPrivate::Tab_*>::size(&this_00->tabList);
      if (qVar5 < 1) {
        currentChanged((QTabBar *)0x6ad986,in_stack_ffffffffffffff5c);
      }
      else {
        in_stack_ffffffffffffff64 = this_00->selectionBehaviorOnRemove;
        if (in_stack_ffffffffffffff64 == SelectLeftTab) {
          qBound<int>((int *)in_RDI,(int *)this_01,(int *)(ulong)in_stack_ffffffffffffff60);
        }
        else if ((in_stack_ffffffffffffff64 == SelectRightTab) ||
                ((in_stack_ffffffffffffff64 == SelectPreviousTab &&
                 ((bVar1 = QTabBarPrivate::validIndex(in_RDI,(int)((ulong)this_01 >> 0x20)), !bVar1
                  || (ppTVar3 = QList<QTabBarPrivate::Tab_*>::at
                                          ((QList<QTabBarPrivate::Tab_*> *)
                                           CONCAT44(in_stack_ffffffffffffff64,
                                                    in_stack_ffffffffffffff60),
                                           CONCAT44(in_stack_ffffffffffffff5c,
                                                    in_stack_ffffffffffffff58)),
                     ((byte)(*ppTVar3)->field_0xe4 >> 1 & 1) == 0)))))) {
          qBound<int>((int *)in_RDI,(int *)this_01,
                      (int *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
        }
        bVar1 = QTabBarPrivate::validIndex(in_RDI,(int)((ulong)this_01 >> 0x20));
        if (bVar1) {
          ppTVar3 = QList<QTabBarPrivate::Tab_*>::at
                              ((QList<QTabBarPrivate::Tab_*> *)
                               CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                               CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
          in_stack_ffffffffffffff60 = (*ppTVar3)->lastTab;
          setCurrentIndex((QTabBar *)CONCAT44(in_stack_ffffffffffffff60,in_stack_ffffffffffffff78),
                          (int)((ulong)in_RDI >> 0x20));
          in_stack_ffffffffffffff7c = in_stack_ffffffffffffff60;
          ppTVar3 = QList<QTabBarPrivate::Tab_*>::at
                              ((QList<QTabBarPrivate::Tab_*> *)
                               CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                               CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
          (*ppTVar3)->lastTab = in_stack_ffffffffffffff60;
        }
        else {
          currentChanged((QTabBar *)0x6ad975,in_stack_ffffffffffffff5c);
        }
      }
    }
    else if (local_c < this_00->currentIndex) {
      setCurrentIndex((QTabBar *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                      (int)((ulong)in_RDI >> 0x20));
    }
    QTabBarPrivate::refresh
              ((QTabBarPrivate *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
    QTabBarPrivate::autoHideTabs(in_RDI);
    bVar1 = QRect::isValid((QRect *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
    if (bVar1) {
      QWidget::update((QWidget *)this_01,
                      (QRect *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
      iVar2 = tabAt((QTabBar *)in_stack_ffffffffffffff80,
                    (QPoint *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
      index_00 = (int)((ulong)in_stack_ffffffffffffff80 >> 0x20);
      this_00->hoverIndex = iVar2;
      bVar1 = QTabBarPrivate::validIndex(in_RDI,(int)((ulong)this_01 >> 0x20));
      if (bVar1) {
        QVar6 = tabRect((QTabBar *)this_02,index_00);
        local_3c = QVar6._0_8_;
        *(undefined8 *)&(this_00->super_QWidgetPrivate).field_0x254 = local_3c;
        local_34 = QVar6._8_8_;
        *(undefined8 *)&this_00->field_0x25c = local_34;
        QWidget::update((QWidget *)this_01,
                        (QRect *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
      }
      else {
        QRect::QRect((QRect *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
        *(undefined8 *)&(this_00->super_QWidgetPrivate).field_0x254 = local_4c;
        *(undefined8 *)&this_00->field_0x25c = local_44;
      }
    }
    (**(code **)(*(long *)&in_RDI->super_QWidgetPrivate + 0x1b8))(in_RDI,local_c);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTabBar::removeTab(int index)
{
    Q_D(QTabBar);
    if (d->validIndex(index)) {
        auto removedTab = d->tabList.at(index);
        if (d->dragInProgress)
            d->moveTabFinished(d->pressedIndex);

#ifndef QT_NO_SHORTCUT
        releaseShortcut(d->tabList.at(index)->shortcutId);
#endif
        if (removedTab->leftWidget) {
            removedTab->leftWidget->hide();
            removedTab->leftWidget->deleteLater();
            removedTab->leftWidget = nullptr;
        }
        if (removedTab->rightWidget) {
            removedTab->rightWidget->hide();
            removedTab->rightWidget->deleteLater();
            removedTab->rightWidget = nullptr;
        }

        int newIndex = removedTab->lastTab;
        d->tabList.removeAt(index);
        delete removedTab;
        for (auto tab : std::as_const(d->tabList)) {
            if (tab->lastTab == index)
                tab->lastTab = -1;
            if (tab->lastTab > index)
                --tab->lastTab;
        }

        d->calculateFirstLastVisible(index, false, true);

        if (index == d->currentIndex) {
            // The current tab is going away, in order to make sure
            // we emit that "current has changed", we need to reset this
            // around.
            d->currentIndex = -1;
            if (d->tabList.size() > 0) {
                switch(d->selectionBehaviorOnRemove) {
                case SelectPreviousTab:
                    if (newIndex > index)
                        newIndex--;
                    if (d->validIndex(newIndex) && d->tabList.at(newIndex)->visible)
                        break;
                    Q_FALLTHROUGH();
                case SelectRightTab:
                    newIndex = qBound(d->firstVisible, index, d->lastVisible);
                    break;
                case SelectLeftTab:
                    newIndex = qBound(d->firstVisible, index-1, d->lastVisible);
                    break;
                default:
                    break;
                }

                if (d->validIndex(newIndex)) {
                    // don't loose newIndex's old through setCurrentIndex
                    int bump = d->tabList.at(newIndex)->lastTab;
                    setCurrentIndex(newIndex);
                    d->tabList.at(newIndex)->lastTab = bump;
                } else {
                    // we had a valid current index, but there are no visible tabs left
                    emit currentChanged(-1);
                }
            } else {
                emit currentChanged(-1);
            }
        } else if (index < d->currentIndex) {
            setCurrentIndex(d->currentIndex - 1);
        }
        d->refresh();
        d->autoHideTabs();
        if (d->hoverRect.isValid()) {
            update(d->hoverRect);
            d->hoverIndex = tabAt(d->mousePosition);
            if (d->validIndex(d->hoverIndex)) {
                d->hoverRect = tabRect(d->hoverIndex);
                update(d->hoverRect);
            } else {
                d->hoverRect = QRect();
            }
        }
        tabRemoved(index);
    }
}